

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O3

bool __thiscall bloaty::RangeMap::CoversRange(RangeMap *this,uint64_t addr,uint64_t size)

{
  _Rb_tree_header *p_Var1;
  const_iterator iter;
  uint64_t uVar2;
  ulong uVar3;
  _Self __tmp;
  bool bVar4;
  
  iter = FindContaining(this,addr);
  uVar3 = size + addr;
  if (CARRY8(size,addr)) {
    __assert_fail("end >= addr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                  ,0x136,"bool bloaty::RangeMap::CoversRange(uint64_t, uint64_t) const");
  }
  bVar4 = uVar3 <= addr;
  p_Var1 = &(this->mappings_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iter._M_node != p_Var1 && !bVar4) {
    while ((*(ulong *)(iter._M_node + 1) <= addr &&
           (uVar2 = RangeEndUnknownLimit(this,iter,0xffffffffffffffff), addr < uVar2))) {
      addr = RangeEndUnknownLimit(this,iter,0xffffffffffffffff);
      iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
      bVar4 = uVar3 <= addr;
      if (bVar4) {
        return bVar4;
      }
      if ((_Rb_tree_header *)iter._M_node == p_Var1) {
        return bVar4;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool RangeMap::CoversRange(uint64_t addr, uint64_t size) const {
  auto it = FindContaining(addr);
  uint64_t end = addr + size;
  assert(end >= addr);

  while (true) {
    if (addr >= end) {
      return true;
    } else if (it == mappings_.end() || !EntryContains(it, addr)) {
      return false;
    }
    addr = RangeEnd(it);
    it++;
  }
}